

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  pointer pOVar2;
  pointer pAVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  pointer pAVar15;
  const_iterator __begin3;
  pointer pOVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ParserInfo parseInfos [512];
  undefined1 local_2178 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2138;
  ulong local_2118;
  string *local_2110;
  undefined1 local_2108 [16];
  undefined1 local_20f8 [40];
  Parser *local_20d0;
  undefined1 local_20c8 [16];
  undefined1 auStack_20b8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2088;
  ParserResult local_2068;
  ulong local_2038 [1025];
  undefined1 auVar20 [16];
  
  pOVar16 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar15 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_20f8._24_8_ = (long)pAVar3 - (long)pAVar15;
  local_2118 = ((long)local_20f8._24_8_ >> 5) * -0x5555555555555555 +
               ((long)pOVar2 - (long)pOVar16 >> 3) * -0x1111111111111111;
  local_2110 = exeName;
  local_20f8._32_8_ = tokens;
  local_20d0 = this;
  if (0x1ff < local_2118) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/unittests/catch.hpp"
                  ,0x2697,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  puVar11 = local_2038;
  lVar14 = 0;
  memset(puVar11,0,0x2000);
  if (pOVar16 != pOVar2) {
    lVar14 = 0;
    do {
      lVar14 = lVar14 + 1;
      *puVar11 = (ulong)pOVar16;
      pOVar16 = pOVar16 + 1;
      puVar11 = puVar11 + 2;
    } while (pOVar16 != pOVar2);
  }
  if (pAVar15 != pAVar3) {
    uVar10 = local_20f8._24_8_ - 0x60;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar10;
    uVar19 = SUB164(auVar25 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar22 = (undefined4)(uVar10 / 0x180000000);
    auVar20._0_8_ = CONCAT44(uVar22,uVar19);
    auVar20._8_4_ = uVar19;
    auVar20._12_4_ = uVar22;
    auVar21._0_8_ = auVar20._0_8_ >> 6;
    auVar21._8_8_ = auVar20._8_8_ >> 6;
    puVar11 = local_2038 + lVar14 * 2 + 2;
    uVar13 = 0;
    auVar21 = auVar21 ^ _DAT_004d00d0;
    do {
      auVar23._8_4_ = (int)pAVar15;
      auVar23._0_8_ = pAVar15;
      auVar23._12_4_ = (int)((ulong)pAVar15 >> 0x20);
      auVar24._8_4_ = (int)uVar13;
      auVar24._0_8_ = uVar13;
      auVar24._12_4_ = (int)(uVar13 >> 0x20);
      auVar25 = (auVar24 | _DAT_004d00c0) ^ _DAT_004d00d0;
      if ((bool)(~(auVar25._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar25._0_4_ ||
                  auVar21._4_4_ < auVar25._4_4_) & 1)) {
        puVar11[-2] = (ulong)pAVar15;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        *puVar11 = auVar23._8_8_ + 0x60;
      }
      uVar13 = uVar13 + 2;
      pAVar15 = pAVar15 + 2;
      puVar11 = puVar11 + 4;
    } while ((uVar10 / 0x60 + 2 & 0xfffffffffffffffe) != uVar13);
  }
  ExeName::set(&local_2068,&local_20d0->m_exeName,local_2110);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0059e0c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p,
                    local_2068.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_0059e120;
  this_00 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
            (auStack_20b8 + 8);
  local_20c8._0_4_ = 1;
  local_20c8._8_8_ = ((Iterator *)local_20f8._32_8_)->_M_current;
  auStack_20b8._0_8_ = ((Iterator *)(local_20f8._32_8_ + 8))->_M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (this_00,(vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                      *)(local_20f8._32_8_ + 0x10));
  local_2178._8_4_ = Ok;
  local_2178._0_8_ = &PTR__ResultValueBase_0059dfc0;
  local_2178._16_4_ = local_20c8._0_4_;
  local_2178._24_8_ = local_20c8._8_8_;
  local_2178._32_8_ = auStack_20b8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2178 + 0x28),this_00);
  local_2178._0_8_ = &PTR__BasicResult_0059df68;
  local_2138._M_dataplus._M_p = (pointer)&local_2138.field_2;
  local_2138._M_string_length = 0;
  local_2138.field_2._M_local_buf[0] = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (this_00);
  uVar10 = local_2118;
  do {
    (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
    local_20c8._0_8_ = local_2178._24_8_;
    local_20c8._8_8_ = local_2178._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
    uVar9 = auStack_20b8._8_8_;
    uVar8 = auStack_20b8._0_8_;
    uVar7 = local_20c8._8_8_;
    uVar6 = local_20c8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8);
    if ((uVar8 == uVar9) && (uVar6 == uVar7)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2178._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_0059dfc0;
      if (local_2178._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2178._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
      }
LAB_003bbf5c:
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0059df68;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2138._M_dataplus._M_p == &local_2138.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_2138.field_2._M_allocated_capacity._1_7_,
                      local_2138.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
             local_2138.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2138._M_dataplus._M_p;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(local_2138.field_2._M_allocated_capacity._1_7_,
                      local_2138.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2138._M_string_length;
      local_2138._M_string_length = 0;
      local_2138.field_2._M_local_buf[0] = '\0';
      local_2138._M_dataplus._M_p = (pointer)&local_2138.field_2;
      goto LAB_003bbfae;
    }
    if (local_2118 == 0) {
      bVar17 = false;
    }
    else {
      bVar17 = true;
      puVar11 = local_2038 + 1;
      uVar13 = 1;
      do {
        plVar4 = (long *)puVar11[-1];
        lVar14 = (**(code **)(*plVar4 + 0x20))(plVar4);
        if ((lVar14 == 0) ||
           (uVar5 = *puVar11, uVar12 = (**(code **)(*plVar4 + 0x20))(plVar4), uVar5 < uVar12)) {
          (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
          local_2108._0_8_ = local_2178._24_8_;
          local_2108._8_8_ = local_2178._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2108 + 0x10),
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2178 + 0x28));
          (**(code **)(*plVar4 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8,plVar4,
                     local_2110,local_2108);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2178,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_2138,&local_2088);
          local_20c8._0_8_ = &PTR__BasicResult_0059df68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2088._M_dataplus._M_p != &local_2088.field_2) {
            operator_delete(local_2088._M_dataplus._M_p,local_2088.field_2._M_allocated_capacity + 1
                           );
          }
          local_20c8._0_8_ = &PTR__ResultValueBase_0059dfc0;
          if (local_20c8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20a0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)(local_2108 + 0x10));
          if (local_2178._8_4_ != Ok) {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2178._8_4_;
            goto LAB_003bbf5c;
          }
          (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
          if (local_2178._16_4_ != NoMatch) {
            *puVar11 = *puVar11 + 1;
            goto LAB_003bbde5;
          }
        }
        bVar17 = uVar13 < local_2118;
        puVar11 = puVar11 + 2;
        bVar18 = uVar13 != uVar10;
        uVar13 = uVar13 + 1;
      } while (bVar18);
      bVar17 = false;
    }
LAB_003bbde5:
    (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
    if (local_2178._16_4_ == ShortCircuitAll) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2178._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_0059dfc0;
      if (local_2178._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = ShortCircuitAll;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
      }
      goto LAB_003bbf5c;
    }
  } while (bVar17);
  (**(_func_int **)(local_2178._0_8_ + 0x10))();
  local_20c8._0_8_ = local_2178._24_8_;
  local_20c8._8_8_ = local_2178._32_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8,
             (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2178 + 0x28));
  if (auStack_20b8._0_8_ == auStack_20b8._8_8_) {
    __assert_fail("!m_tokenBuffer.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/unittests/catch.hpp"
                  ,0x23d3,"const Token *Catch::clara::detail::TokenStream::operator->() const");
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2108,
                   "Unrecognised token: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_20b8._0_8_ + 8));
  BasicResult<Catch::clara::detail::ParseState>::BasicResult
            (__return_storage_ptr__,RuntimeError,(string *)local_2108);
  if ((pointer)local_2108._0_8_ != (pointer)(local_2108 + 0x10)) {
    operator_delete((void *)local_2108._0_8_,local_20f8._0_8_ + 1);
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8);
  local_2178._0_8_ = &PTR__BasicResult_0059df68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2138._M_dataplus._M_p != &local_2138.field_2) {
    operator_delete(local_2138._M_dataplus._M_p,
                    CONCAT71(local_2138.field_2._M_allocated_capacity._1_7_,
                             local_2138.field_2._M_local_buf[0]) + 1);
  }
LAB_003bbfae:
  local_2178._0_8_ = &PTR__ResultValueBase_0059dfc0;
  if (local_2178._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse(std::string const &exeName, TokenStream const &tokens) const -> InternalParseResult override {
          struct ParserInfo {
            ParserBase const *parser = nullptr;
            size_t count = 0;
          };
          const size_t totalParsers = m_options.size() + m_args.size();
          assert(totalParsers < 512);
          // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
          ParserInfo parseInfos[512];

          {
            size_t i = 0;
            for (auto const &opt : m_options)
              parseInfos[i++].parser = &opt;
            for (auto const &arg : m_args)
              parseInfos[i++].parser = &arg;
          }

          m_exeName.set(exeName);

          auto result = InternalParseResult::ok(ParseState(ParseResultType::NoMatch, tokens));
          while (result.value().remainingTokens()) {
            bool tokenParsed = false;

            for (size_t i = 0; i < totalParsers; ++i) {
              auto &parseInfo = parseInfos[i];
              if (parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality()) {
                result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                if (!result)
                  return result;
                if (result.value().type() != ParseResultType::NoMatch) {
                  tokenParsed = true;
                  ++parseInfo.count;
                  break;
                }
              }
            }

            if (result.value().type() == ParseResultType::ShortCircuitAll)
              return result;
            if (!tokenParsed)
              return InternalParseResult::runtimeError("Unrecognised token: " + result.value().remainingTokens()->token);
          }
          // !TBD Check missing required options
          return result;
        }